

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall coins_tests::ccoins_flush_behavior::test_method(ccoins_flush_behavior *this)

{
  long lVar1;
  DBParams db_params;
  pointer puVar2;
  CCoinsViewCacheTest *pCVar3;
  CCoinsViewCacheTest *this_00;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *view;
  pointer puVar4;
  long in_FS_OFFSET;
  CoinsViewOptions options;
  undefined8 uStack_f8;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> local_f0;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  caches;
  undefined1 auStack_d0 [48];
  undefined8 local_a0;
  undefined4 local_98;
  CCoinsViewDB base;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path((path *)(auStack_d0 + 8),"test");
  local_a0 = 0x800000;
  local_98 = 1;
  db_params.path.super_path._M_pathname._M_string_length = (size_type)local_f0._M_head_impl;
  db_params.path.super_path._M_pathname._M_dataplus._M_p = (pointer)uStack_f8;
  db_params.path.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)
       caches.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  db_params.path.super_path._M_pathname.field_2._8_8_ =
       caches.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  db_params.path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )caches.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  db_params.cache_bytes = auStack_d0._0_8_;
  db_params.memory_only = (bool)auStack_d0[8];
  db_params.wipe_data = (bool)auStack_d0[9];
  db_params.obfuscate = (bool)auStack_d0[10];
  db_params.options.force_compact = (bool)auStack_d0[0xb];
  db_params._52_4_ = auStack_d0._12_4_;
  options._8_8_ = 0x1000000;
  options.batch_write_bytes = (size_t)(auStack_d0 + 8);
  CCoinsViewDB::CCoinsViewDB(&base,db_params,options);
  std::filesystem::__cxx11::path::~path((path *)(auStack_d0 + 8));
  caches.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  caches.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  caches.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar3 = (CCoinsViewCacheTest *)operator_new(0x1c8);
  anon_unknown.dwarf_4a5d0d::CCoinsViewCacheTest::CCoinsViewCacheTest(pCVar3,&base.super_CCoinsView)
  ;
  local_f0._M_head_impl = pCVar3;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&caches,(value_type *)&local_f0);
  if (local_f0._M_head_impl != (CCoinsViewCacheTest *)0x0) {
    (*((local_f0._M_head_impl)->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView.
      _vptr_CCoinsView[7])();
  }
  pCVar3 = caches.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl;
  this_00 = (CCoinsViewCacheTest *)operator_new(0x1c8);
  anon_unknown.dwarf_4a5d0d::CCoinsViewCacheTest::CCoinsViewCacheTest(this_00,(CCoinsView *)pCVar3);
  local_f0._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&caches,(value_type *)&local_f0);
  if (local_f0._M_head_impl != (CCoinsViewCacheTest *)0x0) {
    (*((local_f0._M_head_impl)->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView.
      _vptr_CCoinsView[7])();
  }
  puVar2 = caches.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = caches.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    FlushTest::TestFlushBehavior
              (&this->super_FlushTest,
               (puVar4->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
               _M_head_impl,&base,&caches,false);
    FlushTest::TestFlushBehavior
              (&this->super_FlushTest,
               (puVar4->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
               _M_head_impl,&base,&caches,true);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::~vector(&caches);
  CCoinsViewDB::~CCoinsViewDB(&base);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(ccoins_flush_behavior, FlushTest)
{
    // Create two in-memory caches atop a leveldb view.
    CCoinsViewDB base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> caches;
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(&base));
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(caches.back().get()));

    for (const auto& view : caches) {
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/false);
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/true);
    }
}